

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

list * __thiscall
mjs::parser::parse_variable_declaration_list(list *__return_storage_ptr__,parser *this)

{
  bool bVar1;
  token_type tVar2;
  token *this_00;
  wstring *pwVar3;
  wostream *pwVar4;
  char *__addr_len;
  wchar_t *in_R9;
  wstring_view name;
  undefined1 auVar5 [16];
  wstring_view message;
  undefined1 local_340 [80];
  undefined1 local_2f0 [16];
  position_stack_node _expression_position__LINE__;
  unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> local_2a0;
  expression_ptr init;
  undefined1 local_270 [8];
  wstring id;
  source_extend local_220;
  mjs local_208 [16];
  wstring local_1f8;
  wostringstream local_1d8 [8];
  wostringstream _oss;
  wstring local_50 [8];
  wstring n;
  parser *this_local;
  list *l;
  
  std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>::vector(__return_storage_ptr__);
  do {
    if (((this->strict_mode_ & 1U) != 0) && (tVar2 = current_token_type(this), tVar2 == identifier))
    {
      this_00 = current_token(this);
      pwVar3 = token::text_abi_cxx11_(this_00);
      std::__cxx11::wstring::wstring(local_50,(wstring *)pwVar3);
      auVar5 = std::__cxx11::wstring::operator_cast_to_basic_string_view(local_50);
      name._M_str = auVar5._8_8_;
      name._M_len = (size_t)name._M_str;
      bVar1 = is_strict_mode_unassignable_identifier(auVar5._0_8_,name);
      if (bVar1) {
        std::__cxx11::wostringstream::wostringstream(local_1d8);
        pwVar4 = std::operator<<((wostream *)local_1d8,"\"");
        local_208 = (mjs  [16])std::__cxx11::wstring::operator_cast_to_basic_string_view(local_50);
        cpp_quote_abi_cxx11_(&local_1f8,local_208,local_208._8_8_);
        pwVar4 = std::operator<<(pwVar4,(wstring *)&local_1f8);
        std::operator<<(pwVar4,"\" may not appear in a variable declaration in strict mode");
        std::__cxx11::wstring::~wstring((wstring *)&local_1f8);
        current_extend(&local_220,this);
        std::__cxx11::wostringstream::str();
        auVar5 = std::__cxx11::wstring::operator_cast_to_basic_string_view
                           ((wstring *)((long)&id.field_2 + 8));
        message._M_str = in_R9;
        message._M_len = auVar5._8_8_;
        syntax_error((parser *)"parse_variable_declaration_list",(char *)0x320,(int)&local_220,
                     auVar5._0_8_,message);
      }
      std::__cxx11::wstring::~wstring(local_50);
    }
    __addr_len = "parse_variable_declaration_list";
    expect((token *)&init,this,identifier,"parse_variable_declaration_list",0x324);
    pwVar3 = token::text_abi_cxx11_((token *)&init);
    std::__cxx11::wstring::wstring((wstring *)local_270,(wstring *)pwVar3);
    token::~token((token *)&init);
    std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>::
    unique_ptr<std::default_delete<mjs::expression>,void>
              ((unique_ptr<mjs::expression,std::default_delete<mjs::expression>> *)&local_2a0);
    accept((parser *)&_expression_position__LINE__.pos_,(int)this,(sockaddr *)0x1d,
           (socklen_t *)__addr_len);
    bVar1 = token::operator_cast_to_bool((token *)&_expression_position__LINE__.pos_);
    token::~token((token *)&_expression_position__LINE__.pos_);
    if (bVar1) {
      position_stack_node::position_stack_node
                ((position_stack_node *)(local_2f0 + 8),this,&this->expression_pos_);
      parse_assignment_expression((parser *)local_2f0);
      std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator=
                (&local_2a0,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_2f0);
      std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_2f0);
      position_stack_node::~position_stack_node((position_stack_node *)(local_2f0 + 8));
    }
    declaration::declaration((declaration *)(local_340 + 0x28),(wstring *)local_270,&local_2a0);
    std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>::push_back
              (__return_storage_ptr__,(value_type *)(local_340 + 0x28));
    declaration::~declaration((declaration *)(local_340 + 0x28));
    std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr(&local_2a0)
    ;
    std::__cxx11::wstring::~wstring((wstring *)local_270);
    accept((parser *)local_340,(int)this,(sockaddr *)0x20,(socklen_t *)__addr_len);
    bVar1 = token::operator_cast_to_bool((token *)local_340);
    token::~token((token *)local_340);
  } while (bVar1);
  return __return_storage_ptr__;
}

Assistant:

declaration::list parse_variable_declaration_list() {
        declaration::list l;
        do {
            if (strict_mode_ && current_token_type() == token_type::identifier) {
                if (auto n = current_token().text(); is_strict_mode_unassignable_identifier(n)) {
                    // "args" and "arguments" may not be used as variable names
                    SYNTAX_ERROR("\"" << cpp_quote(n) << "\" may not appear in a variable declaration in strict mode");
                }
            }

            auto id = EXPECT(token_type::identifier).text();

            expression_ptr init{};
            if (accept(token_type::equal)) {
                RECORD_EXPRESSION_START;
                init = parse_assignment_expression();
            }
            l.push_back(declaration{id, std::move(init)});
        } while (accept(token_type::comma));
        return l;
    }